

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPClient.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  sockaddr_in servaddr;
  char buff [4096];
  sockaddr local_1038;
  undefined1 local_1028 [4104];
  
  iVar1 = socket(2,1,0);
  bzero(&local_1038,0x10);
  local_1038.sa_family = 2;
  local_1038.sa_data[0] = '\x1f';
  local_1038.sa_data[1] = -0x68;
  inet_pton(2,"127.0.0.1",local_1038.sa_data + 2);
  local_1028[0] = 0;
  iVar2 = connect(iVar1,&local_1038,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=========1:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    write(iVar1," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"strlen(p) = ",0xc);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    sleep(1);
    read(iVar1,local_1028,0x1000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"n=",2);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    printf("%s",local_1028);
    close(iVar1);
  }
  else {
    perror("err1");
  }
  sleep(1);
  iVar1 = socket(2,1,0);
  iVar2 = connect(iVar1,&local_1038,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=========2:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    write(iVar1,"GET  HTTP/1.1",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"strlen(p) = ",0xc);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    sleep(1);
    read(iVar1,local_1028,0x1000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"n=",2);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    printf("%s",local_1028);
    close(iVar1);
  }
  else {
    perror("err2");
  }
  sleep(1);
  iVar1 = socket(2,1,0);
  iVar2 = connect(iVar1,&local_1038,0x10);
  if (iVar2 == 0) {
    setSocketNonBlocking1(iVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"========3:",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    write(iVar1,
          "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n"
          ,0x76);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"strlen(p) = ",0xc);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    sleep(1);
    read(iVar1,local_1028,0x1000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"n=",2);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    printf("%s",local_1028);
    close(iVar1);
  }
  else {
    perror("err3");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  int sockfd;
  struct sockaddr_in servaddr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  bzero(&servaddr, sizeof(servaddr));
  servaddr.sin_family = AF_INET;
  servaddr.sin_port = htons(SERV_PORT);
  inet_pton(AF_INET, IPADDRESS, &servaddr.sin_addr);
  // inet_pton(AF_INET, const char *__restrict __cp, void *__restrict __buf);

  char buff[4096];
  buff[0] = '\0';

  // 发空串
  const char *p = " ";
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========1:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err1");
  }
  sleep(1);


  // 发"GET  HTTP/1.1"
  p = "GET  HTTP/1.1";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========2:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err2");
  }
  sleep(1);

  // 发
  // GET  HTTP/1.1
  // Host: 192.168.52.135:8088
  // Content-Type: application/x-www-form-urlencoded
  // Connection: Keep-Alive
  p = "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: "
      "application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "========3:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err3");
  }
  
  return 0;
}